

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmatrix.cpp
# Opt level: O0

VMatrix * __thiscall VMatrix::adjoint(VMatrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float *in_RSI;
  VMatrix *in_RDI;
  float h33;
  float h32;
  float h31;
  float h23;
  float h22;
  float h21;
  float h13;
  float h12;
  float h11;
  
  fVar1 = in_RSI[4];
  fVar2 = in_RSI[8];
  fVar3 = in_RSI[5];
  fVar4 = in_RSI[7];
  fVar5 = in_RSI[5];
  fVar6 = in_RSI[6];
  fVar7 = in_RSI[3];
  fVar8 = in_RSI[8];
  fVar9 = in_RSI[3];
  fVar10 = in_RSI[7];
  fVar11 = in_RSI[4];
  fVar12 = in_RSI[6];
  fVar13 = in_RSI[2];
  fVar14 = in_RSI[7];
  fVar15 = in_RSI[1];
  fVar16 = in_RSI[8];
  fVar17 = *in_RSI;
  fVar18 = in_RSI[8];
  fVar19 = in_RSI[2];
  fVar20 = in_RSI[6];
  fVar21 = in_RSI[1];
  fVar22 = in_RSI[6];
  fVar23 = *in_RSI;
  fVar24 = in_RSI[7];
  fVar25 = in_RSI[1];
  fVar26 = in_RSI[5];
  fVar27 = in_RSI[2];
  fVar28 = in_RSI[4];
  fVar29 = in_RSI[2];
  fVar30 = in_RSI[3];
  fVar31 = *in_RSI;
  fVar32 = in_RSI[5];
  fVar33 = *in_RSI;
  fVar34 = in_RSI[4];
  fVar35 = in_RSI[1];
  fVar36 = in_RSI[3];
  VMatrix(in_RDI);
  in_RDI->m11 = fVar1 * fVar2 + -(fVar3 * fVar4);
  in_RDI->m12 = fVar13 * fVar14 + -(fVar15 * fVar16);
  in_RDI->m13 = fVar25 * fVar26 + -(fVar27 * fVar28);
  in_RDI->m21 = fVar5 * fVar6 + -(fVar7 * fVar8);
  in_RDI->m22 = fVar17 * fVar18 + -(fVar19 * fVar20);
  in_RDI->m23 = fVar29 * fVar30 + -(fVar31 * fVar32);
  in_RDI->mtx = fVar9 * fVar10 + -(fVar11 * fVar12);
  in_RDI->mty = fVar21 * fVar22 + -(fVar23 * fVar24);
  in_RDI->m33 = fVar33 * fVar34 + -(fVar35 * fVar36);
  in_RDI->mType = None;
  in_RDI->dirty = Project;
  return in_RDI;
}

Assistant:

VMatrix VMatrix::adjoint() const
{
    float h11, h12, h13, h21, h22, h23, h31, h32, h33;
    h11 = m22 * m33 - m23 * mty;
    h21 = m23 * mtx - m21 * m33;
    h31 = m21 * mty - m22 * mtx;
    h12 = m13 * mty - m12 * m33;
    h22 = m11 * m33 - m13 * mtx;
    h32 = m12 * mtx - m11 * mty;
    h13 = m12 * m23 - m13 * m22;
    h23 = m13 * m21 - m11 * m23;
    h33 = m11 * m22 - m12 * m21;

    VMatrix res;
    res.m11 = h11;
    res.m12 = h12;
    res.m13 = h13;
    res.m21 = h21;
    res.m22 = h22;
    res.m23 = h23;
    res.mtx = h31;
    res.mty = h32;
    res.m33 = h33;
    res.mType = MatrixType::None;
    res.dirty = MatrixType::Project;

    return res;
}